

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

VariableData *
CreateFunctionContextVariable
          (ExpressionContext *ctx,SynBase *source,FunctionData *function,FunctionData *prototype)

{
  uint uniqueId;
  bool bVar1;
  uint uVar2;
  uint offset_00;
  TypeRef *type;
  TypeClass *type_00;
  ExprFunctionDefinition *pEVar3;
  SynIdentifier *this;
  InplaceStr name;
  SynIdentifier *nameIdentifier;
  uint offset;
  ExprFunctionDefinition *definition;
  VariableData *context;
  TypeClass *classType;
  TypeRef *refType;
  FunctionData *prototype_local;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    type = getType<TypeRef>(function->contextType);
    if (type == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e3,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    type_00 = getType<TypeClass>(type->subType);
    if (type_00 == (TypeClass *)0x0) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e7,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    anon_unknown.dwarf_e7629::FinalizeAlignment(&type_00->super_TypeStruct);
    bVar1 = IntrusiveList<MemberHandle>::empty(&(type_00->super_TypeStruct).members);
    if (bVar1) {
      ctx_local = (ExpressionContext *)0x0;
    }
    else {
      if (prototype == (FunctionData *)0x0) {
        offset_00 = anon_unknown.dwarf_e7629::AllocateVariableInScope
                              (ctx,source,(type->super_TypeBase).alignment,&type->super_TypeBase);
        this = ExpressionContext::get<SynIdentifier>(ctx);
        uVar2 = ExpressionContext::GetFunctionIndex(ctx,function);
        name = GetFunctionContextVariableName(ctx,function,uVar2);
        SynIdentifier::SynIdentifier(this,name);
        definition = (ExprFunctionDefinition *)ExpressionContext::get<VariableData>(ctx);
        uVar2 = (type->super_TypeBase).alignment;
        uniqueId = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uniqueId + 1;
        VariableData::VariableData
                  ((VariableData *)definition,ctx->allocator,source,ctx->scope,uVar2,
                   &type->super_TypeBase,this,offset_00,uniqueId);
        ExpressionContext::AddVariable(ctx,(VariableData *)definition,true);
      }
      else {
        pEVar3 = getType<ExprFunctionDefinition>(prototype->declaration);
        definition = (ExprFunctionDefinition *)pEVar3->contextVariable;
        ((VariableData *)definition)->isAlloca = false;
        uVar2 = anon_unknown.dwarf_e7629::AllocateVariableInScope
                          (ctx,source,(type->super_TypeBase).alignment,&type->super_TypeBase);
        ((VariableData *)definition)->offset = uVar2;
      }
      ctx_local = (ExpressionContext *)definition;
    }
  }
  else {
    ctx_local = (ExpressionContext *)0x0;
  }
  return (VariableData *)ctx_local;
}

Assistant:

VariableData* CreateFunctionContextVariable(ExpressionContext &ctx, SynBase *source, FunctionData *function, FunctionData *prototype)
{
	if(function->scope->ownerType)
		return NULL;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	FinalizeAlignment(classType);

	if(classType->members.empty())
		return NULL;

	VariableData *context = NULL;

	if(prototype)
	{
		ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(prototype->declaration);

		context = definition->contextVariable;

		context->isAlloca = false;
		context->offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);
	}
	else
	{
		// Create a variable holding a reference to a closure
		unsigned offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		context = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(context, true);
	}

	return context;
}